

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BasePort.cpp
# Opt level: O2

bool __thiscall BasePort::RemoveBoard(BasePort *this,uchar boardId)

{
  BoardIO *pBVar1;
  ulong uVar2;
  uint uVar3;
  ostream *poVar4;
  ulong uVar5;
  undefined7 in_register_00000031;
  
  if (boardId < 0x10) {
    uVar2 = (ulong)boardId;
    pBVar1 = this->BoardList[uVar2];
    if (pBVar1 != (BoardIO *)0x0) {
      this->BoardInUseMask_ =
           this->BoardInUseMask_ & (-2 << (boardId & 0x1f) | 0xfffffffeU >> 0x20 - (boardId & 0x1f))
      ;
      (this->bcReadInfo).boardInfo[boardId].inUse = false;
      this->BoardList[uVar2] = (BoardIO *)0x0;
      pBVar1->port = (BasePort *)0x0;
      this->NumOfBoards_ = this->NumOfBoards_ - 1;
      if (this->max_board - 1 <= (uint)CONCAT71(in_register_00000031,boardId)) {
        this->max_board = 0;
        for (uVar5 = 0; uVar2 != uVar5; uVar5 = uVar5 + 1) {
          if (this->BoardList[uVar5] != (BoardIO *)0x0) {
            this->max_board = (int)uVar5 + 1;
          }
        }
      }
      uVar3 = GetBroadcastReadSizeQuads(this);
      (this->bcReadInfo).readSizeQuads = uVar3;
      return true;
    }
    poVar4 = std::operator<<(this->outStr,"BasePort::RemoveBoard: board not found: ");
  }
  else {
    poVar4 = std::operator<<(this->outStr,"BasePort::RemoveBoard: board number out of range: ");
  }
  poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
  std::endl<char,std::char_traits<char>>(poVar4);
  return false;
}

Assistant:

bool BasePort::RemoveBoard(unsigned char boardId)
{
    if (boardId >= BoardIO::MAX_BOARDS) {
        outStr << "BasePort::RemoveBoard: board number out of range: " << static_cast<unsigned int>(boardId) << std::endl;
        return false;
    }
    BoardIO *board = BoardList[boardId];
    if (!board) {
        outStr << "BasePort::RemoveBoard: board not found: " << static_cast<unsigned int>(boardId) << std::endl;
        return false;
    }

    // update BoardInuseMask_
    BoardInUseMask_ = (BoardInUseMask_ & (~(1 << boardId)));
    bcReadInfo.boardInfo[boardId].inUse = false;

    BoardList[boardId] = 0;
    board->port = 0;
    NumOfBoards_--;

    if (boardId >= max_board-1) {
        // If max_board was just removed, find the new max_board
        max_board = 0;
        for (int bd = 0; bd < boardId; bd++)
            if (BoardList[bd]) max_board = bd+1;
    }

    bcReadInfo.readSizeQuads = GetBroadcastReadSizeQuads();

    return true;
}